

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddLoopConstraint
          (ConstraintSet *this,uint idPredecessor,uint idSuccessor,SpatialTransform *XPredecessor,
          SpatialTransform *XSuccessor,SpatialVector *constraintAxisInPredecessor,
          bool enableBaumgarteStabilization,double stabilizationTimeConstant,char *constraintName,
          uint userDefinedId)

{
  double *pdVar1;
  ostream *poVar2;
  LoopConstraint *this_00;
  pointer puVar3;
  pointer pSVar4;
  iterator __position;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  SpatialTransform *pSVar15;
  RBDLError *this_01;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint i;
  long lVar19;
  string *psVar20;
  bool bVar21;
  long lVar22;
  Index new_rows;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar23;
  allocator_type local_259;
  string nameStr;
  undefined1 local_210 [16];
  double local_200;
  string local_1f8;
  value_type local_1d8;
  SpatialTransform frameErrorPre;
  void *local_e0;
  
  uVar17 = *(long *)(this + 0x10) - *(long *)(this + 8) >> 2;
  uVar18 = *(long *)(this + 0x100) - *(long *)(this + 0xf8);
  uVar16 = (uint)uVar17;
  if (uVar18 != 0) {
    this_00 = *(LoopConstraint **)(*(long *)(this + 0xf8) + (ulong)((int)(uVar18 >> 4) - 1) * 0x10);
    puVar3 = (this_00->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((*puVar3 == idPredecessor) && (puVar3[1] == idSuccessor)) {
      pSVar15 = &frameErrorPre;
      lVar19 = 0;
      psVar20 = &nameStr;
      pSVar4 = (this_00->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      frameErrorPre.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] =
           (XPredecessor->r).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] -
           *(double *)
            &(pSVar4->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
      ;
      dVar12 = (XPredecessor->r).super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1] - *(double *)((long)&(pSVar4->r).super_Vector3d + 8);
      auVar6._8_4_ = SUB84(dVar12,0);
      auVar6._0_8_ = frameErrorPre.r.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0];
      auVar6._12_4_ = (int)((ulong)dVar12 >> 0x20);
      frameErrorPre.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[1] = (double)auVar6._8_8_;
      frameErrorPre.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[2] =
           (XPredecessor->r).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
           *(double *)((long)&(pSVar4->r).super_Vector3d + 0x10);
      frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           (XPredecessor->E).super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] -
           *(double *)&(pSVar4->E).super_Matrix3d;
      dVar12 = (XPredecessor->E).super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [1] - *(double *)((long)&(pSVar4->E).super_Matrix3d + 8);
      auVar7._8_4_ = SUB84(dVar12,0);
      auVar7._0_8_ = frameErrorPre.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar7._12_4_ = (int)((ulong)dVar12 >> 0x20);
      frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = (double)auVar7._8_8_;
      frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] =
           (XPredecessor->E).super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] -
           *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x10);
      dVar12 = (XPredecessor->E).super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [3] - *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x18);
      auVar8._8_4_ = SUB84(dVar12,0);
      auVar8._0_8_ = frameErrorPre.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar8._12_4_ = (int)((ulong)dVar12 >> 0x20);
      frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = (double)auVar8._8_8_;
      frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] =
           (XPredecessor->E).super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] -
           *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x20);
      dVar12 = (XPredecessor->E).super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [5] - *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x28);
      auVar9._8_4_ = SUB84(dVar12,0);
      auVar9._0_8_ = frameErrorPre.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[4];
      auVar9._12_4_ = (int)((ulong)dVar12 >> 0x20);
      frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = (double)auVar9._8_8_;
      frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] =
           (XPredecessor->E).super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] -
           *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x30);
      dVar12 = (XPredecessor->E).super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [7] - *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x38);
      auVar10._8_4_ = SUB84(dVar12,0);
      auVar10._0_8_ =
           frameErrorPre.E.super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6];
      auVar10._12_4_ = (int)((ulong)dVar12 >> 0x20);
      frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[7] = (double)auVar10._8_8_;
      frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[8] =
           (XPredecessor->E).super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] -
           *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x40);
      dVar12 = (XSuccessor->r).super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1] - *(double *)((long)&pSVar4[1].r.super_Vector3d + 8);
      local_210._8_4_ = SUB84(dVar12,0);
      local_210._0_8_ =
           (XSuccessor->r).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] -
           *(double *)
            &pSVar4[1].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
      ;
      local_210._12_4_ = (int)((ulong)dVar12 >> 0x20);
      local_200 = (XSuccessor->r).super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] - *(double *)((long)&pSVar4[1].r.super_Vector3d + 0x10);
      nameStr._M_dataplus._M_p =
           (pointer)((XSuccessor->E).super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[0] - *(double *)&pSVar4[1].E.super_Matrix3d);
      dVar12 = (XSuccessor->E).super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [1] - *(double *)((long)&pSVar4[1].E.super_Matrix3d + 8);
      auVar11._8_4_ = SUB84(dVar12,0);
      auVar11._0_8_ = nameStr._M_dataplus._M_p;
      auVar11._12_4_ = (int)((ulong)dVar12 >> 0x20);
      nameStr._M_string_length = auVar11._8_8_;
      dVar12 = (XSuccessor->E).super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [3] - *(double *)((long)&pSVar4[1].E.super_Matrix3d + 0x18);
      nameStr.field_2._8_4_ = SUB84(dVar12,0);
      nameStr.field_2._M_allocated_capacity =
           (size_type)
           ((XSuccessor->E).super_Matrix3d.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] -
           *(double *)((long)&pSVar4[1].E.super_Matrix3d + 0x10));
      nameStr.field_2._12_4_ = (int)((ulong)dVar12 >> 0x20);
      bVar21 = true;
      do {
        if ((2.220446049250313e-14 <
             ABS(*(double *)
                  ((long)frameErrorPre.r.super_Vector3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar19 * 8))) ||
           (2.220446049250313e-14 < ABS(*(double *)(local_210 + lVar19 * 8)))) {
          bVar21 = false;
        }
        lVar22 = 0;
        do {
          if ((2.220446049250313e-14 <
               ABS(*(double *)
                    ((long)(pSVar15->E).super_Matrix3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + lVar22))) ||
             (2.220446049250313e-14 < ABS(*(double *)((long)&(psVar20->_M_dataplus)._M_p + lVar22)))
             ) {
            bVar21 = false;
          }
          lVar22 = lVar22 + 0x18;
        } while (lVar22 != 0x48);
        lVar19 = lVar19 + 1;
        pSVar15 = (SpatialTransform *)
                  ((pSVar15->E).super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 1);
        psVar20 = (string *)&psVar20->_M_string_length;
      } while (lVar19 != 3);
      if ((bVar21) && ((this_00->super_Constraint).id == userDefinedId)) {
        LoopConstraint::appendConstraintAxis(this_00,constraintAxisInPredecessor,true,true);
        goto LAB_00138729;
      }
    }
  }
  LoopConstraint::LoopConstraint
            ((LoopConstraint *)&frameErrorPre,idPredecessor,idSuccessor,XPredecessor,XSuccessor,
             constraintAxisInPredecessor,enableBaumgarteStabilization,stabilizationTimeConstant,
             constraintName,userDefinedId,true,true);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = nameStr._M_string_length;
  nameStr._0_16_ = auVar13 << 0x40;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RigidBodyDynamics::LoopConstraint,std::allocator<RigidBodyDynamics::LoopConstraint>,RigidBodyDynamics::LoopConstraint&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&nameStr._M_string_length,
             (LoopConstraint **)&nameStr,(allocator<RigidBodyDynamics::LoopConstraint> *)&local_1d8,
             (LoopConstraint *)&frameErrorPre);
  std::
  vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>>>
  ::emplace_back<std::shared_ptr<RigidBodyDynamics::LoopConstraint>>
            ((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>>>
              *)(this + 0xf8),(shared_ptr<RigidBodyDynamics::LoopConstraint> *)&nameStr);
  if (nameStr._M_string_length != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)nameStr._M_string_length);
  }
  lVar19 = *(long *)(this + 0xf8);
  lVar22 = (ulong)((int)((ulong)(*(long *)(this + 0x100) - lVar19) >> 4) - 1) * 0x10;
  *(uint *)(*(long *)(lVar19 + lVar22) + 0x34) = uVar16;
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
  ::emplace_back<std::shared_ptr<RigidBodyDynamics::LoopConstraint>&>
            ((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
              *)(this + 200),(shared_ptr<RigidBodyDynamics::LoopConstraint> *)(lVar19 + lVar22));
  frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0] = (double)&PTR_bind_00198c68;
  if (local_e0 != (void *)0x0) {
    free(local_e0);
  }
  Constraint::~Constraint((Constraint *)&frameErrorPre);
LAB_00138729:
  frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0]._0_4_ = 1;
  __position._M_current = *(ConstraintType **)(this + 0x10);
  if (__position._M_current == *(ConstraintType **)(this + 0x18)) {
    std::
    vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>::
    _M_realloc_insert<RigidBodyDynamics::ConstraintType>
              ((vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
                *)(this + 8),__position,(ConstraintType *)&frameErrorPre);
  }
  else {
    *__position._M_current = ConstraintTypeLoop;
    *(ConstraintType **)(this + 0x10) = __position._M_current + 1;
  }
  nameStr._M_string_length = 0;
  nameStr._M_dataplus._M_p = (pointer)&nameStr.field_2;
  auVar14[0xf] = 0;
  auVar14._0_15_ = nameStr.field_2._1_15_;
  nameStr.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )(auVar14 << 8);
  if (constraintName != (char *)0x0) {
    strlen(constraintName);
    std::__cxx11::string::_M_replace((ulong)&nameStr,0,(char *)0x0,(ulong)constraintName);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 0x20),&nameStr);
  uVar18 = uVar17 + 1 & 0xffffffff;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x110),uVar18,uVar18,1);
  uVar17 = uVar17 & 0xffffffff;
  *(undefined8 *)(*(long *)(this + 0x110) + uVar17 * 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x120),uVar18,uVar18,1);
  *(undefined8 *)(*(long *)(this + 0x120) + uVar17 * 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x130),uVar18,uVar18,1);
  *(undefined8 *)(*(long *)(this + 0x130) + uVar17 * 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x140),uVar18,uVar18,1);
  *(undefined8 *)(*(long *)(this + 0x140) + uVar17 * 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x150),uVar18,uVar18,1);
  ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x150))->m_data[uVar17] = 0.0;
  local_1d8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  local_1d8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_1d8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)&frameErrorPre,uVar18,&local_1d8,
             &local_259);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_move_assign
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x600),&frameErrorPre);
  if (frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] != 0.0) {
    operator_delete((void *)frameErrorPre.E.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[0],
                    (long)frameErrorPre.E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[2] -
                    (long)frameErrorPre.E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[0]);
  }
  if (nameStr._M_string_length != 0) {
    lVar19 = *(long *)(this + 0xd0);
    lVar22 = *(long *)(this + 200);
    pdVar1 = (double *)
             ((long)frameErrorPre.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x10);
    lVar5 = *(long *)(*(long *)(this + 0x28) + -0x20);
    frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = (double)pdVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&frameErrorPre,lVar5,*(long *)(*(long *)(this + 0x28) + -0x18) + lVar5);
    frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4]._0_4_ = (int)((ulong)(lVar19 - lVar22) >> 4) + -1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                *)(this + 0x38),
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)&frameErrorPre);
    if ((double *)
        frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] != pdVar1) {
      operator_delete((void *)frameErrorPre.E.super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[0],
                      (long)frameErrorPre.E.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[2] + 1);
    }
  }
  if (userDefinedId != 0xffffffff) {
    frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] =
         (double)CONCAT44((int)((ulong)(*(long *)(this + 0xd0) - *(long *)(this + 200)) >> 4) + -1,
                          userDefinedId);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
    ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                *)(this + 0x68),(pair<unsigned_int,_unsigned_int> *)&frameErrorPre);
  }
  frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0]._4_4_ =
       (int)((ulong)(*(long *)(this + 0xd0) - *(long *)(this + 200)) >> 4) + -1;
  frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0]._0_4_ = uVar16;
  pVar23 = std::
           _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
           ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
                     ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                       *)(this + 0x98),(pair<unsigned_int,_unsigned_int> *)&frameErrorPre);
  if (pVar23.second != false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameStr._M_dataplus._M_p != &nameStr.field_2) {
      operator_delete(nameStr._M_dataplus._M_p,nameStr.field_2._M_allocated_capacity + 1);
    }
    return uVar16;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&frameErrorPre);
  poVar2 = (ostream *)
           ((long)frameErrorPre.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Error: Constraint row entry in system is not unique.",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," (This should not be possible: contact the maintainer of this code.)",0x44);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_01 = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  Errors::RBDLError::RBDLError(this_01,&local_1f8);
  __cxa_throw(this_01,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int ConstraintSet::AddLoopConstraint (
  unsigned int idPredecessor,
  unsigned int idSuccessor,
  const Math::SpatialTransform &XPredecessor,
  const Math::SpatialTransform &XSuccessor,
  const Math::SpatialVector &constraintAxisInPredecessor,
  bool enableBaumgarteStabilization,
  double stabilizationTimeConstant,
  const char *constraintName,
  unsigned int userDefinedId)
{
  assert (bound == false);


  unsigned int insertAtRowInG = unsigned(size());
  unsigned int rowsInG = insertAtRowInG+1;

  double tol = std::numeric_limits<double>::epsilon()*100.;
  bool constraintAppended = false;
  unsigned int idx = unsigned(loopConstraints.size());

  if(loopConstraints.size() > 0) {
    idx = idx-1;
    if(loopConstraints[idx]->getBodyIds()[0] == idPredecessor &&
        loopConstraints[idx]->getBodyIds()[1] == idSuccessor) {

      bool framesNumericallyIdentical=true;
      SpatialTransform frameErrorPre, frameErrorSuc;

      frameErrorPre.r=XPredecessor.r-loopConstraints[idx]->getBodyFrames()[0].r;
      frameErrorPre.E=XPredecessor.E-loopConstraints[idx]->getBodyFrames()[0].E;

      frameErrorSuc.r=XSuccessor.r  -loopConstraints[idx]->getBodyFrames()[1].r;
      frameErrorSuc.E=XSuccessor.E  -loopConstraints[idx]->getBodyFrames()[1].E;

      //Using this awkward element by element comparison to maintain
      //compatibility with SimpleMath.
#ifndef RBDL_USE_CASADI_MATH
      for(unsigned int i=0; i<frameErrorPre.r.size(); ++i) {
        if(fabs(frameErrorPre.r[i]) > tol || fabs(frameErrorSuc.r[i]) > tol) {
          framesNumericallyIdentical=false;
        }
        for(unsigned int j=0; j<frameErrorPre.E.cols(); ++j) {
          if(fabs(frameErrorPre.E(i,j))>tol || fabs(frameErrorSuc.E(i,j))>tol) {
            framesNumericallyIdentical=false;
          }
        }
      }
#endif

      if(framesNumericallyIdentical
         && loopConstraints[idx]->getUserDefinedId() == userDefinedId) {
        constraintAppended = true;
        loopConstraints[idx]->appendConstraintAxis(constraintAxisInPredecessor);
      }
    }
  }

  if(constraintAppended==false) {

    LoopConstraint loopCon( idPredecessor, idSuccessor,
                            XPredecessor,  XSuccessor,
                            constraintAxisInPredecessor,
                            enableBaumgarteStabilization,
                            stabilizationTimeConstant,
                            constraintName,
                            userDefinedId);

    loopConstraints.push_back(std::make_shared<LoopConstraint>(loopCon));
    idx = unsigned(loopConstraints.size()-1);
    loopConstraints[idx]->addToConstraintSet(insertAtRowInG);
    constraints.emplace_back(loopConstraints[idx]);
  }

  constraintType.push_back(ConstraintTypeLoop);

  //Update all of the struct arrays so that they have the correct number
  //of elements
  std::string nameStr;
  if (constraintName != NULL) {
    nameStr = constraintName;
  }

  name.push_back (nameStr);


  err.conservativeResize(rowsInG);
  err[insertAtRowInG] = 0.;
  errd.conservativeResize(rowsInG);
  errd[insertAtRowInG] = 0.;

  force.conservativeResize (rowsInG);
  force[insertAtRowInG] = 0.;

  impulse.conservativeResize (rowsInG);
  impulse[insertAtRowInG] = 0.;

  v_plus.conservativeResize (rowsInG);
  v_plus[insertAtRowInG] = 0.;

  d_multdof3_u = std::vector<Math::Vector3d>(rowsInG, Math::Vector3d::Zero());

  //Set up access maps
  if(nameStr.size() > 0) {
    std::pair< std::map<std::string, unsigned int>::iterator, bool > iter;
    iter = nameGroupMap.insert(std::pair<std::string, unsigned int>(
                                 name[name.size()-1],
                                 unsigned(constraints.size()-1)));
    //if(iter.second == false){
    //  std::cerr << "Error: optional name is not unique."
    //            << std::endl;
    //  assert(0);
    //  abort();
    //}

  }

  if(userDefinedId < std::numeric_limits<unsigned int>::max()) {
    std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
    iter =userDefinedIdGroupMap.insert( std::pair<unsigned int, unsigned int>(
                                          userDefinedId,
                                          unsigned(constraints.size()-1)));
    //if(iter.second == false){
    //  std::cerr << "Error: optional userDefinedId is not unique."
    //            << std::endl;
    //  assert(0);
    //  abort();
    //}
  }

  std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
  iter = idGroupMap.insert(std::pair<unsigned int, unsigned int>(
                             unsigned(rowsInG-1),
                             unsigned(constraints.size()-1)));
  if(iter.second == false) {
    std::stringstream errormsg;
    errormsg << "Error: Constraint row entry in system is not unique."
             << " (This should not be possible: contact the "
             "maintainer of this code.)"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  return rowsInG-1;
}